

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

MatchMatrix * __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<google::protobuf::Map<int,proto2_nofieldpresence_unittest::ForeignEnum>const&>
::
AnalyzeElements<google::protobuf::Map<int,proto2_nofieldpresence_unittest::ForeignEnum>::const_iterator>
          (MatchMatrix *__return_storage_ptr__,
          UnorderedElementsAreMatcherImpl<google::protobuf::Map<int,proto2_nofieldpresence_unittest::ForeignEnum>const&>
          *this,const_iterator elem_first,const_iterator elem_last,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchResultListener *listener)

{
  pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum> *extraout_RDX;
  pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum> *value;
  pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum> *extraout_RDX_00;
  size_t sVar1;
  long lVar2;
  pointer pcVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  DummyMatchResultListener dummy;
  allocator_type local_99;
  vector<char,_std::allocator<char>_> local_98;
  string local_78;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  MatchResultListener *local_50;
  size_t local_48;
  MatchResultListener local_40;
  
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)element_printouts;
  local_50 = listener;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(element_printouts,
                    (element_printouts->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  sVar5 = 0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_40.stream_ = (ostream *)0x0;
  local_40._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_01870a48;
  if (elem_first.super_UntypedMapIterator.node_ != elem_last.super_UntypedMapIterator.node_) {
    sVar5 = 0;
    value = extraout_RDX;
    do {
      local_48 = sVar5;
      if (local_50->stream_ != (ostream *)0x0) {
        PrintToString<std::pair<int_const,proto2_nofieldpresence_unittest::ForeignEnum>>
                  (&local_78,(testing *)(elem_first.super_UntypedMapIterator.node_ + 1),value);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_58,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_),
                          local_78.field_2._M_allocated_capacity + 1);
        }
      }
      lVar2 = *(long *)(this + 0x28);
      if (*(long *)(this + 0x30) != lVar2) {
        lVar4 = 0;
        lVar6 = 0;
        do {
          local_78._M_dataplus._M_p._0_1_ =
               MatcherBase<const_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_&>
               ::MatchAndExplain((MatcherBase<const_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_&>
                                  *)(lVar2 + lVar4),
                                 (pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum> *)
                                 (elem_first.super_UntypedMapIterator.node_ + 1),&local_40);
          std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_98,(char *)&local_78);
          lVar6 = lVar6 + 1;
          lVar2 = *(long *)(this + 0x28);
          lVar4 = lVar4 + 0x18;
        } while (lVar6 != (*(long *)(this + 0x30) - lVar2 >> 3) * -0x5555555555555555);
      }
      sVar5 = local_48 + 1;
      google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::const_iterator::
      operator++(&elem_first);
      value = extraout_RDX_00;
    } while (elem_first.super_UntypedMapIterator.node_ != elem_last.super_UntypedMapIterator.node_);
  }
  sVar1 = (*(long *)(this + 0x30) - *(long *)(this + 0x28) >> 3) * -0x5555555555555555;
  __return_storage_ptr__->num_elements_ = sVar5;
  __return_storage_ptr__->num_matchers_ = sVar1;
  local_78._M_dataplus._M_p._0_1_ = 0;
  std::vector<char,_std::allocator<char>_>::vector
            (&__return_storage_ptr__->matched_,sVar1 * sVar5,(value_type *)&local_78,&local_99);
  if (sVar5 != 0) {
    lVar4 = *(long *)(this + 0x28);
    lVar2 = *(long *)(this + 0x30);
    sVar1 = 0;
    pcVar3 = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      bVar7 = lVar2 != lVar4;
      lVar2 = lVar4;
      if (bVar7) {
        lVar2 = 0;
        do {
          (__return_storage_ptr__->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl
          .super__Vector_impl_data._M_start[lVar2 + __return_storage_ptr__->num_matchers_ * sVar1] =
               pcVar3[lVar2] != '\0';
          lVar2 = lVar2 + 1;
          lVar4 = *(long *)(this + 0x28);
        } while (lVar2 != (*(long *)(this + 0x30) - lVar4 >> 3) * -0x5555555555555555);
        pcVar3 = pcVar3 + lVar2;
        lVar2 = *(long *)(this + 0x30);
      }
      sVar1 = sVar1 + 1;
    } while (sVar1 != sVar5);
  }
  if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

MatchMatrix AnalyzeElements(ElementIter elem_first, ElementIter elem_last,
                              ::std::vector<std::string>* element_printouts,
                              MatchResultListener* listener) const {
    element_printouts->clear();
    ::std::vector<char> did_match;
    size_t num_elements = 0;
    DummyMatchResultListener dummy;
    for (; elem_first != elem_last; ++num_elements, ++elem_first) {
      if (listener->IsInterested()) {
        element_printouts->push_back(PrintToString(*elem_first));
      }
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        did_match.push_back(
            matchers_[irhs].MatchAndExplain(*elem_first, &dummy));
      }
    }

    MatchMatrix matrix(num_elements, matchers_.size());
    ::std::vector<char>::const_iterator did_match_iter = did_match.begin();
    for (size_t ilhs = 0; ilhs != num_elements; ++ilhs) {
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        matrix.SetEdge(ilhs, irhs, *did_match_iter++ != 0);
      }
    }
    return matrix;
  }